

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O1

ValueLength __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
objectLength(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  uint uVar1;
  ValueLength VVar2;
  ulong uVar3;
  byte bVar4;
  byte *pbVar5;
  byte *pbVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  pbVar6 = *(byte **)this;
  bVar4 = *pbVar6;
  if (bVar4 == 10) {
switchD_0010ed95_default:
    return 0;
  }
  if (bVar4 == 0x14) {
    bVar4 = 0;
    lVar7 = 0;
    pbVar5 = pbVar6;
    do {
      lVar10 = lVar7;
      pbVar5 = pbVar5 + 1;
      lVar9 = (ulong)(*pbVar5 & 0x7f) << (bVar4 & 0x3f);
      bVar4 = bVar4 + 7;
      lVar7 = lVar10 + lVar9;
    } while ((char)*pbVar5 < '\0');
    pbVar6 = pbVar6 + lVar9 + lVar10;
    VVar2 = 0;
    bVar4 = 0;
    do {
      pbVar6 = pbVar6 + -1;
      VVar2 = VVar2 + ((ulong)(*pbVar6 & 0x7f) << (bVar4 & 0x3f));
      bVar4 = bVar4 + 7;
    } while ((char)*pbVar6 < '\0');
    return VVar2;
  }
  uVar1 = SliceStaticData::WidthMap[bVar4];
  uVar3 = (ulong)uVar1;
  if (7 < uVar3) {
    switch(uVar1) {
    case 8:
      lVar7 = *(long *)(pbVar6 + 1);
      break;
    default:
      lVar7 = 0;
    }
    if (7 < uVar1 - 1) {
      return 0;
    }
    lVar9 = -uVar3;
    switch(uVar1) {
    case 1:
      return (ulong)pbVar6[lVar9 + lVar7];
    case 2:
      return (ulong)*(ushort *)(pbVar6 + lVar9 + lVar7);
    case 3:
      uVar8 = (ulong)((uint)pbVar6[lVar9 + lVar7 + 1] << 8 | (uint)pbVar6[lVar9 + lVar7 + 2] << 0x10
                     );
      uVar3 = (ulong)pbVar6[lVar9 + lVar7];
      break;
    case 4:
      return (ulong)*(uint *)(pbVar6 + lVar9 + lVar7);
    case 5:
      uVar8 = (ulong)*(uint *)(pbVar6 + lVar9 + lVar7);
      uVar3 = (ulong)pbVar6[lVar9 + lVar7 + 4];
      goto LAB_0010eed6;
    case 6:
      uVar8 = (ulong)*(uint *)(pbVar6 + lVar9 + lVar7);
      uVar3 = (ulong)*(ushort *)(pbVar6 + lVar9 + lVar7 + 4);
      goto LAB_0010eed6;
    case 7:
      uVar8 = (ulong)CONCAT12(pbVar6[lVar9 + lVar7 + 6],*(undefined2 *)(pbVar6 + lVar9 + lVar7 + 4))
              << 0x20;
      uVar3 = (ulong)*(uint *)(pbVar6 + lVar9 + lVar7);
      break;
    case 8:
      return *(ValueLength *)(pbVar6 + lVar9 + lVar7);
    }
    goto LAB_0010eef4;
  }
  switch(uVar1) {
  case 1:
    return (ulong)pbVar6[uVar3 + 1];
  case 2:
    return (ulong)*(ushort *)(pbVar6 + uVar3 + 1);
  case 3:
    uVar8 = (ulong)((uint)pbVar6[uVar3 + 2] << 8 | (uint)pbVar6[uVar3 + 3] << 0x10);
    uVar3 = (ulong)pbVar6[uVar3 + 1];
    break;
  case 4:
    return (ulong)*(uint *)(pbVar6 + uVar3 + 1);
  case 5:
    uVar8 = (ulong)*(uint *)(pbVar6 + uVar3 + 1);
    uVar3 = (ulong)pbVar6[uVar3 + 5];
    goto LAB_0010eed6;
  case 6:
    uVar8 = (ulong)*(uint *)(pbVar6 + uVar3 + 1);
    uVar3 = (ulong)*(ushort *)(pbVar6 + uVar3 + 5);
LAB_0010eed6:
    return uVar3 << 0x20 | uVar8;
  case 7:
    uVar8 = (ulong)CONCAT12(pbVar6[uVar3 + 7],*(undefined2 *)(pbVar6 + uVar3 + 5)) << 0x20;
    uVar3 = (ulong)*(uint *)(pbVar6 + uVar3 + 1);
    break;
  default:
    goto switchD_0010ed95_default;
  }
LAB_0010eef4:
  return uVar3 | uVar8;
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }